

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  ImGuiWindow *window;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  window = GImGui->CurrentWindow;
  fVar3 = (GImGui->Style).ItemSpacing.y;
  fVar4 = (window->WindowPadding).y;
  fVar1 = (window->DC).CursorPosPrevLine.y;
  uVar2 = -(uint)(fVar3 <= fVar4);
  fVar3 = (float)(~uVar2 & (uint)fVar3 | (uint)fVar4 & uVar2);
  fVar4 = fVar1 - fVar3;
  SetScrollFromPosY(window,(((fVar1 + (window->DC).PrevLineSize.y + fVar3) - fVar4) * center_y_ratio
                           + fVar4) - (window->Pos).y,center_y_ratio);
  fVar3 = (window->WindowPadding).y - fVar3;
  (window->ScrollTargetEdgeSnapDist).y = (float)(~-(uint)(fVar3 <= 0.0) & (uint)fVar3);
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = ImMax(window->WindowPadding.y, g.Style.ItemSpacing.y);
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}